

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3OpenTokenizer
              (sqlite3_tokenizer *pTokenizer,int iLangid,char *z,int n,
              sqlite3_tokenizer_cursor **ppCsr)

{
  int local_44;
  sqlite3_tokenizer_cursor *psStack_40;
  int rc;
  sqlite3_tokenizer_cursor *pCsr;
  sqlite3_tokenizer_module *pModule;
  sqlite3_tokenizer_cursor **ppCsr_local;
  char *pcStack_20;
  int n_local;
  char *z_local;
  sqlite3_tokenizer *psStack_10;
  int iLangid_local;
  sqlite3_tokenizer *pTokenizer_local;
  
  pCsr = (sqlite3_tokenizer_cursor *)pTokenizer->pModule;
  psStack_40 = (sqlite3_tokenizer_cursor *)0x0;
  pModule = (sqlite3_tokenizer_module *)ppCsr;
  ppCsr_local._4_4_ = n;
  pcStack_20 = z;
  z_local._4_4_ = iLangid;
  psStack_10 = pTokenizer;
  local_44 = (*((sqlite3_tokenizer_module *)pCsr)->xOpen)(pTokenizer,z,n,&stack0xffffffffffffffc0);
  if (((local_44 == 0) && (psStack_40->pTokenizer = psStack_10, 0 < *(int *)&pCsr->pTokenizer)) &&
     (local_44 = (*(code *)pCsr[6].pTokenizer)(psStack_40,z_local._4_4_), local_44 != 0)) {
    (*(code *)pCsr[4].pTokenizer)(psStack_40);
    psStack_40 = (sqlite3_tokenizer_cursor *)0x0;
  }
  *(sqlite3_tokenizer_cursor **)pModule = psStack_40;
  return local_44;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3OpenTokenizer(
  sqlite3_tokenizer *pTokenizer,
  int iLangid,
  const char *z,
  int n,
  sqlite3_tokenizer_cursor **ppCsr
){
  sqlite3_tokenizer_module const *pModule = pTokenizer->pModule;
  sqlite3_tokenizer_cursor *pCsr = 0;
  int rc;

  rc = pModule->xOpen(pTokenizer, z, n, &pCsr);
  assert( rc==SQLITE_OK || pCsr==0 );
  if( rc==SQLITE_OK ){
    pCsr->pTokenizer = pTokenizer;
    if( pModule->iVersion>=1 ){
      rc = pModule->xLanguageid(pCsr, iLangid);
      if( rc!=SQLITE_OK ){
        pModule->xClose(pCsr);
        pCsr = 0;
      }
    }
  }
  *ppCsr = pCsr;
  return rc;
}